

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_xml_lite.cpp
# Opt level: O0

Tag * Omega_h::xml_lite::read_tag(Tag *__return_storage_ptr__,istream *stream)

{
  bool bVar1;
  bool check;
  string local_38 [8];
  string line;
  istream *stream_local;
  Tag *st;
  
  std::__cxx11::string::string(local_38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(stream,local_38);
  Tag::Tag(__return_storage_ptr__);
  bVar1 = parse_tag((string *)local_38,__return_storage_ptr__);
  if (!bVar1) {
    fail("assertion %s failed at %s +%d\n","check",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_xml_lite.cpp"
         ,0x6b);
  }
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

xml_lite::Tag read_tag(std::istream& stream) {
  std::string line;
  std::getline(stream, line);
  xml_lite::Tag st;
  auto check = parse_tag(line, &st);
  OMEGA_H_CHECK(check);
  return st;
}